

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::Generator::FieldReferencingExpression_abi_cxx11_
          (string *__return_storage_ptr__,Generator *this,Descriptor *containing_type,
          FieldDescriptor *field,string_view python_dict_name)

{
  FileDescriptor **v1;
  FileDescriptor **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  FileDescriptor *this_00;
  string_view sVar2;
  string_view name;
  string_view format;
  Arg *in_stack_fffffffffffffde8;
  Arg local_178;
  Generator *local_148;
  size_t sStack_140;
  Arg local_130;
  string local_100;
  Arg local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  string_view local_a0;
  string_view local_90;
  string_view local_80;
  LogMessage local_60;
  Voidify local_49;
  FileDescriptor *local_48;
  Nullable<const_char_*> local_40;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  FieldDescriptor *field_local;
  Descriptor *containing_type_local;
  Generator *this_local;
  string_view python_dict_name_local;
  
  python_dict_name_local._M_len = (size_t)python_dict_name._M_str;
  this_local = (Generator *)python_dict_name._M_len;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)field;
  field_local = (FieldDescriptor *)containing_type;
  containing_type_local = (Descriptor *)this;
  python_dict_name_local._M_str = (char *)__return_storage_ptr__;
  local_48 = FieldDescriptor::file(field);
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::FileDescriptor_const*>(&local_48);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::FileDescriptor_const*>(&this->file_);
  local_40 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*>
                       (v1,v2,"field.file() == file_");
  if (local_40 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_40);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/generator.cc"
               ,0x448,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
    this_00 = FieldDescriptor::file((FieldDescriptor *)absl_log_internal_check_op_result);
    local_80 = FileDescriptor::name(this_00);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,local_80);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,(char (*) [6])" vs. ");
    local_90 = FileDescriptor::name(this->file_);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,local_90);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_60);
  }
  if (field_local == (FieldDescriptor *)0x0) {
    local_a0 = FieldDescriptor::name((FieldDescriptor *)absl_log_internal_check_op_result);
    name._M_str = (char *)field;
    name._M_len = (size_t)local_a0._M_str;
    ResolveKeyword_abi_cxx11_(__return_storage_ptr__,(python *)local_a0._M_len,name);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_b0,"$0.$1[\'$2\']");
    ModuleLevelDescriptorName<google::protobuf::Descriptor>
              (&local_100,this,(Descriptor *)field_local);
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_e0,&local_100);
    local_148 = this_local;
    sStack_140 = python_dict_name_local._M_len;
    sVar2._M_str = (char *)python_dict_name_local._M_len;
    sVar2._M_len = (size_t)this_local;
    absl::lts_20250127::substitute_internal::Arg::Arg(&local_130,sVar2);
    sVar2 = FieldDescriptor::name((FieldDescriptor *)absl_log_internal_check_op_result);
    absl::lts_20250127::substitute_internal::Arg::Arg(&local_178,sVar2);
    format._M_str = (char *)&local_e0;
    format._M_len = (size_t)local_b0._M_str;
    absl::lts_20250127::Substitute_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)local_b0._M_len,format,&local_130,&local_178,
               in_stack_fffffffffffffde8);
    std::__cxx11::string::~string((string *)&local_100);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::FieldReferencingExpression(
    const Descriptor* containing_type, const FieldDescriptor& field,
    absl::string_view python_dict_name) const {
  // We should only ever be looking up fields in the current file.
  // The only things we refer to from other files are message descriptors.
  ABSL_CHECK_EQ(field.file(), file_)
      << field.file()->name() << " vs. " << file_->name();
  if (!containing_type) {
    return ResolveKeyword(field.name());
  }
  return absl::Substitute("$0.$1['$2']",
                          ModuleLevelDescriptorName(*containing_type),
                          python_dict_name, field.name());
}